

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  mime_encoder_state *st;
  byte bVar1;
  char acVar2 [4];
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  int ateof_00;
  undefined7 in_register_00000011;
  size_t sVar6;
  ulong __n;
  bool bVar7;
  undefined8 uStack_50;
  char buf [4];
  size_t local_40;
  
  ateof_00 = (int)CONCAT71(in_register_00000011,ateof);
  st = &part->encstate;
  sVar6 = (part->encstate).bufbeg;
  local_40 = 0;
  do {
    acVar2 = buf;
    if ((part->encstate).bufend <= sVar6) {
      return local_40;
    }
    buf[0] = (part->encstate).buf[sVar6];
    bVar1 = ""[(byte)buf[0]];
    sVar6 = (size_t)bVar1;
    buf[1] = "0123456789ABCDEF"[(byte)buf[0] >> 4];
    buf[3] = acVar2[3];
    buf[2] = "0123456789ABCDEF"[(byte)buf[0] & 0xf];
    __n = sVar6;
    if (bVar1 != 1) {
      if (bVar1 == 3) {
        uStack_50 = 0x492a6f;
        iVar3 = qp_lookahead_eol(st,ateof_00,0);
        if (iVar3 != 1) {
LAB_00492a74:
          if (iVar3 == -1) {
            return local_40;
          }
          goto LAB_00492a7d;
        }
        buf[1] = '\n';
        sVar6 = 2;
        __n = sVar6;
      }
      else if (bVar1 == 2) {
        sVar6 = 1;
        uStack_50 = 0x492a56;
        iVar3 = qp_lookahead_eol(st,ateof_00,1);
        __n = sVar6;
        if (iVar3 != 0) goto LAB_00492a74;
      }
      else {
LAB_00492a7d:
        buf[0] = '=';
        sVar6 = 1;
        __n = 3;
      }
    }
    if (buf[__n - 1] != '\n') {
      uVar4 = st->pos + __n;
      if (uVar4 == 0x4c) {
        uStack_50 = 0x492ac2;
        iVar3 = qp_lookahead_eol(st,ateof_00,sVar6);
        if (iVar3 == 0) {
LAB_00492acf:
          builtin_strncpy(buf,"=\r\n",4);
          __n = 3;
          sVar6 = 0;
        }
        else if (iVar3 == -1) {
          return local_40;
        }
      }
      else if (0x4c < uVar4) goto LAB_00492acf;
    }
    bVar7 = size < __n;
    size = size - __n;
    if (bVar7) {
      if (local_40 != 0) {
        return local_40;
      }
      return 0xfffffffffffffffe;
    }
    uStack_50 = 0x492af2;
    memcpy(buffer,buf,__n);
    local_40 = local_40 + __n;
    buffer = buffer + __n;
    sVar5 = 0;
    if (buf[__n - 1] != '\n') {
      sVar5 = (part->encstate).pos + __n;
    }
    (part->encstate).pos = sVar5;
    sVar6 = sVar6 + (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar6;
  } while( true );
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    size_t len = 1;
    size_t consumed = 1;
    int i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size) {
      if(!cursize)
        return STOP_FILLING;
      break;
    }

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}